

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O0

shared_ptr<ApplicationContextBase>
CreateApplicationContext(GraphicsContext *gc,shared_ptr<UIContext> *ui)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<UIContext> *in_RSI;
  element_type *in_RDI;
  shared_ptr<ApplicationContextBase> sVar1;
  element_type *this;
  
  this = in_RDI;
  std::make_shared<ApplicationContext,GraphicsContext&,std::shared_ptr<UIContext>&>
            ((GraphicsContext *)in_RDI,in_RSI);
  std::shared_ptr<ApplicationContextBase>::shared_ptr<ApplicationContext,void>
            ((shared_ptr<ApplicationContextBase> *)this,(shared_ptr<ApplicationContext> *)in_RDI);
  std::shared_ptr<ApplicationContext>::~shared_ptr((shared_ptr<ApplicationContext> *)0x115ef6);
  sVar1.super___shared_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<ApplicationContextBase>)
         sVar1.super___shared_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ApplicationContextBase> CreateApplicationContext(GraphicsContext& gc, std::shared_ptr<UIContext> ui)
{
    return std::make_shared<ApplicationContext>(gc, ui);
}